

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_27f4c0::PeerManagerImpl::ProcessCompactBlockTxns
          (PeerManagerImpl *this,CNode *pfrom,Peer *peer,BlockTransactions *block_transactions)

{
  uint256 *puVar1;
  _Atomic_word *p_Var2;
  pointer *ppCVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  PartiallyDownloadedBlock *this_00;
  base_blob<256U> *pbVar7;
  bool bVar8;
  ReadStatus RVar9;
  _Self __tmp;
  pointer this_01;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  _Var10;
  Logger *pLVar11;
  string *message;
  CBlock *block;
  undefined1 *puVar12;
  long in_FS_OFFSET;
  string_view source_file;
  optional<long> from_peer;
  optional<long> from_peer_00;
  optional<long> from_peer_01;
  string_view source_file_00;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  pVar13;
  string_view logging_function;
  string_view logging_function_00;
  uint local_8c;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock75;
  string local_78;
  vector<CInv,_std::allocator<CInv>_> invs;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (pointer)operator_new(0x80);
  *(undefined8 *)((this_01->hash).super_base_blob<256U>.m_data._M_elems + 4) = 0x100000001;
  *(undefined ***)this_01 = &PTR___Sp_counted_ptr_inplace_00afb0b8;
  pbVar7 = &this_01[3].hash.super_base_blob<256U>;
  (pbVar7->m_data)._M_elems[9] = '\0';
  (pbVar7->m_data)._M_elems[10] = '\0';
  pbVar7 = &(this_01->hash).super_base_blob<256U>;
  (pbVar7->m_data)._M_elems[0xc] = '\0';
  (pbVar7->m_data)._M_elems[0xd] = '\0';
  (pbVar7->m_data)._M_elems[0xe] = '\0';
  (pbVar7->m_data)._M_elems[0xf] = '\0';
  (pbVar7->m_data)._M_elems[0x10] = '\0';
  (pbVar7->m_data)._M_elems[0x11] = '\0';
  (pbVar7->m_data)._M_elems[0x12] = '\0';
  (pbVar7->m_data)._M_elems[0x13] = '\0';
  pbVar7 = &(this_01->hash).super_base_blob<256U>;
  (pbVar7->m_data)._M_elems[0x14] = '\0';
  (pbVar7->m_data)._M_elems[0x15] = '\0';
  (pbVar7->m_data)._M_elems[0x16] = '\0';
  (pbVar7->m_data)._M_elems[0x17] = '\0';
  (pbVar7->m_data)._M_elems[0x18] = '\0';
  (pbVar7->m_data)._M_elems[0x19] = '\0';
  (pbVar7->m_data)._M_elems[0x1a] = '\0';
  (pbVar7->m_data)._M_elems[0x1b] = '\0';
  *(undefined8 *)((this_01->hash).super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
  *(undefined8 *)this_01[1].hash.super_base_blob<256U>.m_data._M_elems = 0;
  *(undefined8 *)((long)this_01[1].hash.super_base_blob<256U>.m_data._M_elems + 8) = 0;
  *(undefined8 *)((long)this_01[1].hash.super_base_blob<256U>.m_data._M_elems + 0x10) = 0;
  *(undefined8 *)((long)this_01[1].hash.super_base_blob<256U>.m_data._M_elems + 0x18) = 0;
  this_01[2].type = 0;
  this_01[2].hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  this_01[2].hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  this_01[2].hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  this_01[2].hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  *(undefined8 *)((long)this_01[2].hash.super_base_blob<256U>.m_data._M_elems + 4) = 0;
  *(undefined8 *)((long)this_01[2].hash.super_base_blob<256U>.m_data._M_elems + 0xc) = 0;
  *(undefined8 *)((long)this_01[2].hash.super_base_blob<256U>.m_data._M_elems + 0x14) = 0;
  *(undefined8 *)((long)this_01[2].hash.super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
  puVar1 = &this_01[3].hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::clear((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)((long)this_01[2].hash.super_base_blob<256U>.m_data._M_elems + 0x14));
  pbVar7 = &this_01[3].hash.super_base_blob<256U>;
  (pbVar7->m_data)._M_elems[8] = '\0';
  (pbVar7->m_data)._M_elems[9] = '\0';
  this_01[3].hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  criticalblock75.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock75.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock75.super_unique_lock);
  pVar13 = std::
           multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
           ::equal_range(&this->mapBlocksInFlight,&block_transactions->blockhash);
  _Var10 = pVar13.first._M_node;
  if (_Var10._M_node != pVar13.second._M_node._M_node) {
    block = (CBlock *)((this_01->hash).super_base_blob<256U>.m_data._M_elems + 0xc);
    lVar5 = *(long *)(_Var10._M_node + 2);
    lVar6 = pfrom->id;
    do {
      if ((*(long *)(_Var10._M_node + 2) == lVar6) &&
         (this_00 = (PartiallyDownloadedBlock *)(_Var10._M_node[2]._M_parent)->_M_right,
         this_00 != (PartiallyDownloadedBlock *)0x0)) {
        RVar9 = PartiallyDownloadedBlock::FillBlock(this_00,block,&block_transactions->txn);
        if (RVar9 == READ_STATUS_FAILED) {
          if (lVar5 != lVar6) {
            from_peer_01.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._8_8_ = 1;
            from_peer_01.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_payload =
                 (_Storage<long,_true>)(_Storage<long,_true>)pfrom->id;
            RemoveBlockRequest(this,&block_transactions->blockhash,from_peer_01);
            pLVar11 = LogInstance();
            bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar11,NET,Debug);
            if (bVar8) {
              invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)pfrom->id;
              source_file_00._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
              ;
              source_file_00._M_len = 0x62;
              logging_function_00._M_str = "ProcessCompactBlockTxns";
              logging_function_00._M_len = 0x17;
              LogPrintFormatInternal<long>
                        (logging_function_00,source_file_00,0xe50,NET,Debug,
                         (ConstevalFormatString<1U>)0x7d5d6c,(long *)&invs);
            }
            goto LAB_001dd821;
          }
          invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_8c = ((uint)(peer->m_their_services)._M_i & 8) << 0x1b | 2;
          std::vector<CInv,std::allocator<CInv>>::emplace_back<unsigned_int,uint256_const&>
                    ((vector<CInv,std::allocator<CInv>> *)&invs,&local_8c,
                     &block_transactions->blockhash);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"getdata","");
          (anonymous_namespace)::PeerManagerImpl::
          MakeAndPushMessage<std::vector<CInv,std::allocator<CInv>>&>
                    ((PeerManagerImpl *)this->m_connman,pfrom,&local_78,&invs);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
              _M_start == (pointer)0x0) goto LAB_001dd821;
          puVar12 = (undefined1 *)
                    ((long)invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage -
                    (long)invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        else {
          if (RVar9 != READ_STATUS_INVALID) {
            from_peer_00.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._8_8_ = 1;
            from_peer_00.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_payload =
                 (_Storage<long,_true>)(_Storage<long,_true>)pfrom->id;
            RemoveBlockRequest(this,&block_transactions->blockhash,from_peer_00);
            invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)pfrom->id;
            invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)((ulong)invs.super__Vector_base<CInv,_std::allocator<CInv>_>.
                                         _M_impl.super__Vector_impl_data._M_finish &
                                 0xffffffffffffff00);
            std::
            _Rb_tree<uint256,std::pair<uint256_const,std::pair<long,bool>>,std::_Select1st<std::pair<uint256_const,std::pair<long,bool>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,bool>>>>
            ::_M_emplace_unique<uint256_const&,std::pair<long,bool>>
                      ((_Rb_tree<uint256,std::pair<uint256_const,std::pair<long,bool>>,std::_Select1st<std::pair<uint256_const,std::pair<long,bool>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,bool>>>>
                        *)&this->mapBlockSource,&block_transactions->blockhash,
                       (pair<long,_bool> *)&invs);
            std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock75.super_unique_lock)
            ;
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2 = (_Atomic_word *)((this_01->hash).super_base_blob<256U>.m_data._M_elems + 4);
              *p_Var2 = *p_Var2 + 1;
              UNLOCK();
            }
            else {
              p_Var2 = (_Atomic_word *)((this_01->hash).super_base_blob<256U>.m_data._M_elems + 4);
              *p_Var2 = *p_Var2 + 1;
            }
            invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)block;
            invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
            _M_finish = this_01;
            ProcessBlock(this,pfrom,(shared_ptr<const_CBlock> *)&invs,true,true);
            if (invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data
                ._M_finish != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                         super__Vector_impl_data._M_finish);
            }
            goto LAB_001dd82b;
          }
          from_peer.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ = 1;
          from_peer.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload =
               (_Storage<long,_true>)(_Storage<long,_true>)pfrom->id;
          RemoveBlockRequest(this,&block_transactions->blockhash,from_peer);
          ppCVar3 = &invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)ppCVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&invs,"invalid compact block/non-matching block transactions","");
          Misbehaving((PeerManagerImpl *)peer,(Peer *)&invs,message);
          if (invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
              _M_start == (pointer)ppCVar3) goto LAB_001dd821;
          puVar12 = (undefined1 *)
                    ((long)&(invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage)->type + 1);
        }
        operator_delete(invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)puVar12);
        goto LAB_001dd821;
      }
      _Var10._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var10._M_node);
    } while (_Var10._M_node != pVar13.second._M_node._M_node);
  }
  pLVar11 = LogInstance();
  bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar11,NET,Debug);
  if (bVar8) {
    invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)pfrom->id;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
    ;
    source_file._M_len = 0x62;
    logging_function._M_str = "ProcessCompactBlockTxns";
    logging_function._M_len = 0x17;
    LogPrintFormatInternal<long>
              (logging_function,source_file,0xe3e,NET,Debug,(ConstevalFormatString<1U>)0x7d5cf3,
               (long *)&invs);
  }
LAB_001dd821:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock75.super_unique_lock);
LAB_001dd82b:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ProcessCompactBlockTxns(CNode& pfrom, Peer& peer, const BlockTransactions& block_transactions)
{
    std::shared_ptr<CBlock> pblock = std::make_shared<CBlock>();
    bool fBlockRead{false};
    {
        LOCK(cs_main);

        auto range_flight = mapBlocksInFlight.equal_range(block_transactions.blockhash);
        size_t already_in_flight = std::distance(range_flight.first, range_flight.second);
        bool requested_block_from_this_peer{false};

        // Multimap ensures ordering of outstanding requests. It's either empty or first in line.
        bool first_in_flight = already_in_flight == 0 || (range_flight.first->second.first == pfrom.GetId());

        while (range_flight.first != range_flight.second) {
            auto [node_id, block_it] = range_flight.first->second;
            if (node_id == pfrom.GetId() && block_it->partialBlock) {
                requested_block_from_this_peer = true;
                break;
            }
            range_flight.first++;
        }

        if (!requested_block_from_this_peer) {
            LogDebug(BCLog::NET, "Peer %d sent us block transactions for block we weren't expecting\n", pfrom.GetId());
            return;
        }

        PartiallyDownloadedBlock& partialBlock = *range_flight.first->second.second->partialBlock;
        ReadStatus status = partialBlock.FillBlock(*pblock, block_transactions.txn);
        if (status == READ_STATUS_INVALID) {
            RemoveBlockRequest(block_transactions.blockhash, pfrom.GetId()); // Reset in-flight state in case Misbehaving does not result in a disconnect
            Misbehaving(peer, "invalid compact block/non-matching block transactions");
            return;
        } else if (status == READ_STATUS_FAILED) {
            if (first_in_flight) {
                // Might have collided, fall back to getdata now :(
                std::vector<CInv> invs;
                invs.emplace_back(MSG_BLOCK | GetFetchFlags(peer), block_transactions.blockhash);
                MakeAndPushMessage(pfrom, NetMsgType::GETDATA, invs);
            } else {
                RemoveBlockRequest(block_transactions.blockhash, pfrom.GetId());
                LogDebug(BCLog::NET, "Peer %d sent us a compact block but it failed to reconstruct, waiting on first download to complete\n", pfrom.GetId());
                return;
            }
        } else {
            // Block is either okay, or possibly we received
            // READ_STATUS_CHECKBLOCK_FAILED.
            // Note that CheckBlock can only fail for one of a few reasons:
            // 1. bad-proof-of-work (impossible here, because we've already
            //    accepted the header)
            // 2. merkleroot doesn't match the transactions given (already
            //    caught in FillBlock with READ_STATUS_FAILED, so
            //    impossible here)
            // 3. the block is otherwise invalid (eg invalid coinbase,
            //    block is too big, too many legacy sigops, etc).
            // So if CheckBlock failed, #3 is the only possibility.
            // Under BIP 152, we don't discourage the peer unless proof of work is
            // invalid (we don't require all the stateless checks to have
            // been run).  This is handled below, so just treat this as
            // though the block was successfully read, and rely on the
            // handling in ProcessNewBlock to ensure the block index is
            // updated, etc.
            RemoveBlockRequest(block_transactions.blockhash, pfrom.GetId()); // it is now an empty pointer
            fBlockRead = true;
            // mapBlockSource is used for potentially punishing peers and
            // updating which peers send us compact blocks, so the race
            // between here and cs_main in ProcessNewBlock is fine.
            // BIP 152 permits peers to relay compact blocks after validating
            // the header only; we should not punish peers if the block turns
            // out to be invalid.
            mapBlockSource.emplace(block_transactions.blockhash, std::make_pair(pfrom.GetId(), false));
        }
    } // Don't hold cs_main when we call into ProcessNewBlock
    if (fBlockRead) {
        // Since we requested this block (it was in mapBlocksInFlight), force it to be processed,
        // even if it would not be a candidate for new tip (missing previous block, chain not long enough, etc)
        // This bypasses some anti-DoS logic in AcceptBlock (eg to prevent
        // disk-space attacks), but this should be safe due to the
        // protections in the compact block handler -- see related comment
        // in compact block optimistic reconstruction handling.
        ProcessBlock(pfrom, pblock, /*force_processing=*/true, /*min_pow_checked=*/true);
    }
    return;
}